

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

void __thiscall OpenMD::SelectionEvaluator::define(SelectionEvaluator *this)

{
  SelectionSet SStack_78;
  string variable;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_40;
  
  std::any_cast<std::__cxx11::string>
            (&variable,
             &(this->statement).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
              _M_impl.super__Vector_impl_data._M_start[1].value);
  expression(&SStack_78,this,&this->statement,2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_OpenMD::SelectionSet,_true>
            (&local_40,&variable,&SStack_78);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::any>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
              *)&this->variables,&local_40);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::~pair(&local_40);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&SStack_78.bitsets_);
  std::__cxx11::string::~string((string *)&variable);
  return;
}

Assistant:

void SelectionEvaluator::define() {
    assert(statement.size() >= 3);

    std::string variable = std::any_cast<std::string>(statement[1].value);

    variables.insert(
        VariablesType::value_type(variable, expression(statement, 2)));
  }